

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RectMatrix.hpp
# Opt level: O2

void __thiscall
OpenMD::RectMatrix<double,_3U,_3U>::add
          (RectMatrix<double,_3U,_3U> *this,RectMatrix<double,_3U,_3U> *m)

{
  uint i;
  long lVar1;
  uint j;
  long lVar2;
  
  for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
    for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
      (*(double (*) [3])*(double (*) [3])this)[lVar2] =
           (*(double (*) [3])*(double (*) [3])m)[lVar2] +
           (*(double (*) [3])*(double (*) [3])this)[lVar2];
    }
    m = (RectMatrix<double,_3U,_3U> *)((long)m + 0x18);
    this = (RectMatrix<double,_3U,_3U> *)((long)this + 0x18);
  }
  return;
}

Assistant:

inline void add(const RectMatrix<Real, Row, Col>& m) {
      for (unsigned int i = 0; i < Row; i++)
        for (unsigned int j = 0; j < Col; j++)
          this->data_[i][j] += m.data_[i][j];
    }